

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O2

ParserResult *
parse_const_statement
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  Token TVar1;
  TokenData *token;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  SyntaxTree *pSVar5;
  __shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  unreachable_exception *this;
  Token type;
  ParserState *this_00;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  *this_01;
  TokenData *it;
  NodeType local_374;
  TokenData *local_370;
  undefined8 local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_360 [2];
  undefined1 local_350 [8];
  undefined1 auStack_348 [80];
  size_t local_2f8;
  shared_ptr<SyntaxTree> local_2f0;
  token_iterator begin_local;
  undefined1 local_2d8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_2c8 [10];
  __shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> local_278;
  __shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> local_268;
  ParserState value;
  ParserState identifier;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  local_1a0;
  undefined8 local_150;
  undefined8 local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  ParserState local_138;
  ParserState local_e0;
  ParserState local_88;
  
  begin_local = begin;
  if ((begin == end) || (1 < begin->type - CONST_INT)) {
    local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffff00000000;
    make_error<ParserStatus,TokenStream::TokenData_const*&>
              ((ParserState *)local_350,(ParserStatus *)local_2d8,&begin_local);
    __return_storage_ptr__->first = end;
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&__return_storage_ptr__->second,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)local_350);
    this_01 = (anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
               *)local_350;
  }
  else {
    local_1a0._0_8_ = 0;
    local_1a0._8_8_ = 0;
    local_350 = (undefined1  [8])0x0;
    auStack_348._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_150 = 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_348);
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._64_8_ = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._72_8_ = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._48_8_ = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._56_8_ = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._32_8_ = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._40_8_ = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._16_8_ = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._24_8_ = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._0_8_ = 0;
    identifier._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._8_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._64_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._72_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._48_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._56_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._32_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._40_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._16_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._24_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._0_8_ = 0;
    value._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._8_8_ = 0;
    TVar1 = begin->type;
    if (TVar1 == CONST_INT) {
      local_374 = CONST_INT;
    }
    else {
      if (TVar1 != CONST_FLOAT) {
        this = (unreachable_exception *)__cxa_allocate_exception(0x10);
        unreachable_exception::unreachable_exception
                  (this,
                   "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/parser_syntax.cpp(783)."
                  );
        __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
      }
      local_374 = CONST_FLOAT;
    }
    it = begin + 1;
    parse_identifier((ParserResult *)local_350,parser,it,end);
    local_2d8._0_8_ = &identifier;
    local_2d8._8_8_ = &it;
    std::
    tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
    ::operator=((tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
                 *)local_2d8,
                (pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
                 *)local_350);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                 *)auStack_348);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&local_88,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&identifier);
    giveup_to_expected((ParserState *)local_350,&local_88,"identifier");
    add_error((ParserState *)&local_1a0._tail,(ParserState *)local_350);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                 *)local_350);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::~_storage(&local_88._storage);
    token = it;
    if (TVar1 == CONST_INT) {
      local_370 = it;
      if ((it == end) || (it->type != Integer)) {
        local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_368._4_4_ << 0x20)
        ;
        make_error<ParserStatus,TokenStream::TokenData_const*&>
                  ((ParserState *)local_2d8,(ParserStatus *)&local_368,&local_370);
        local_350 = (undefined1  [8])end;
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                    *)auStack_348,
                   (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                    *)local_2d8);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
        ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                     *)local_2d8);
      }
      else {
        pSVar5 = (SyntaxTree *)operator_new(0x88);
        SyntaxTree::SyntaxTree(pSVar5,Integer,&parser->instream,token);
        std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                  ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)&local_368,pSVar5);
        auStack_348._8_8_ = a_Stack_360[0]._M_pi;
        auStack_348._0_8_ = local_368;
        local_350 = (undefined1  [8])(token + 1);
        local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        a_Stack_360[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2d8._8_8_ = 0;
        a_Stack_2c8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2f8 = 1;
        local_2d8._0_8_ = local_350;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_2c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_360);
      }
      local_2d8._8_8_ = &it;
      local_2d8._0_8_ = &value;
      std::
      tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
      ::operator=((tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
                   *)local_2d8,
                  (pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
                   *)local_350);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                   *)auStack_348);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_e0,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&value);
      giveup_to_expected((ParserState *)local_350,&local_e0,"integer");
      add_error((ParserState *)&local_1a0._tail,(ParserState *)local_350);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                   *)local_350);
      this_00 = &local_e0;
    }
    else {
      local_370 = it;
      if ((it == end) || (it->type != Float)) {
        local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_368._4_4_ << 0x20)
        ;
        make_error<ParserStatus,TokenStream::TokenData_const*&>
                  ((ParserState *)local_2d8,(ParserStatus *)&local_368,&local_370);
        local_350 = (undefined1  [8])end;
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                    *)auStack_348,
                   (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                    *)local_2d8);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
        ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                     *)local_2d8);
      }
      else {
        pSVar5 = (SyntaxTree *)operator_new(0x88);
        SyntaxTree::SyntaxTree(pSVar5,Float,&parser->instream,token);
        std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                  ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)&local_368,pSVar5);
        auStack_348._8_8_ = a_Stack_360[0]._M_pi;
        auStack_348._0_8_ = local_368;
        local_350 = (undefined1  [8])(token + 1);
        local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        a_Stack_360[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2d8._8_8_ = 0;
        a_Stack_2c8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2f8 = 1;
        local_2d8._0_8_ = local_350;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_2c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_360);
      }
      local_2d8._8_8_ = &it;
      local_2d8._0_8_ = &value;
      std::
      tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
      ::operator=((tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
                   *)local_2d8,
                  (pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
                   *)local_350);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                   *)auStack_348);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_138,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&value);
      giveup_to_expected((ParserState *)local_350,&local_138,"float");
      add_error((ParserState *)&local_1a0._tail,(ParserState *)local_350);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                   *)local_350);
      this_00 = &local_138;
    }
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::~_storage(&this_00->_storage);
    expect_newline((ParserState *)&local_1a0._tail,it,end);
    it = parser_aftertoken(it,end,type);
    bVar4 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                      ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                       &local_1a0._tail);
    if (bVar4) {
      pSVar5 = (SyntaxTree *)operator_new(0x88);
      SyntaxTree::SyntaxTree(pSVar5,local_374,&parser->instream,begin);
      std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)local_2d8,pSVar5);
      uVar2 = local_2d8._0_8_;
      pSVar5 = (SyntaxTree *)operator_new(0x88);
      SyntaxTree::SyntaxTree(pSVar5,Text,&parser->instream,begin);
      std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)&local_2f0,pSVar5);
      SyntaxTree::add_child((SyntaxTree *)uVar2,&local_2f0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2f0.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      uVar2 = local_2d8._0_8_;
      p_Var6 = (__shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)
               eggs::variants::
               get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                         (&identifier);
      std::__shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_268,p_Var6);
      SyntaxTree::add_child((SyntaxTree *)uVar2,(shared_ptr<SyntaxTree> *)&local_268);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
      uVar2 = local_2d8._0_8_;
      p_Var6 = (__shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)
               eggs::variants::
               get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                         (&value);
      std::__shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_278,p_Var6);
      SyntaxTree::add_child((SyntaxTree *)uVar2,(shared_ptr<SyntaxTree> *)&local_278);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
      uVar3 = local_2d8._8_8_;
      uVar2 = local_2d8._0_8_;
      local_148 = 0;
      _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_350 = (undefined1  [8])it;
      local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      a_Stack_360[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      auStack_348._8_8_ = 0;
      __return_storage_ptr__->first = it;
      local_2d8._0_8_ = (SyntaxTree *)0x0;
      local_2d8._8_8_ = (TokenData **)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->second)._storage.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        .
        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
        .field_0 = uVar2;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->second)._storage.
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               .
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               .
               super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
               .field_0 + 8) = uVar3;
      auStack_348._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->second)._storage.
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      ._which = 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_348 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_360);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_140);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    }
    else {
      __return_storage_ptr__->first = it;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&__return_storage_ptr__->second,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_1a0._tail);
    }
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::~_storage(&value._storage);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::~_storage(&identifier._storage);
    this_01 = &local_1a0;
  }
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
               *)&this_01->_tail);
  return __return_storage_ptr__;
}

Assistant:

static ParserResult parse_const_statement(ParserContext& parser, token_iterator begin, token_iterator end)
{
    if(begin != end
        && (begin->type == Token::CONST_INT || begin->type == Token::CONST_FLOAT))
    {
        ParserState state = ParserSuccess(nullptr);
        ParserState identifier, value;

        auto type = begin->type == Token::CONST_INT? NodeType::CONST_INT :
                    begin->type == Token::CONST_FLOAT? NodeType::CONST_FLOAT : Unreachable();

        auto it = std::next(begin);
        std::tie(it, identifier) = parse_identifier(parser, it, end);
        add_error(state, giveup_to_expected(identifier, "identifier"));

        if(type == NodeType::CONST_INT)
        {
            std::tie(it, value) = parse_integer(parser, it, end);
            add_error(state, giveup_to_expected(value, "integer"));
        }
        else if(type == NodeType::CONST_FLOAT)
        {
            std::tie(it, value) = parse_float(parser, it, end);
            add_error(state, giveup_to_expected(value, "float"));
        }

        expect_newline(state, it, end);
        it = parser_aftertoken(it, end, Token::NewLine);

        if(is<ParserSuccess>(state))
        {
            shared_ptr<SyntaxTree> tree(new SyntaxTree(type, parser.instream, *begin));
            tree->add_child(shared_ptr<SyntaxTree> { new SyntaxTree(NodeType::Text, parser.instream, *begin) });
            tree->add_child(get<ParserSuccess>(identifier).tree);
            tree->add_child(get<ParserSuccess>(value).tree);
            return std::make_pair(it, ParserSuccess(std::move(tree)));
        }
        else
        {
            return std::make_pair(it, std::move(state));
        }
    }
    return std::make_pair(end, make_error(ParserStatus::GiveUp, begin));
}